

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

ZSTD_compressionParameters *
ZSTD_getCParamsFromCCtxParams
          (ZSTD_compressionParameters *__return_storage_ptr__,ZSTD_CCtx_params *CCtxParams,
          U64 srcSizeHint,size_t dictSize)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ZSTD_strategy ZVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ZSTD_compressionParameters cPar;
  undefined1 auVar6 [16];
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ZSTD_compressionParameters local_44;
  
  if (srcSizeHint == 0xffffffffffffffff) {
    srcSizeHint = 0xffffffffffffffff;
    if (0 < (long)CCtxParams->srcSizeHint) {
      srcSizeHint = (long)CCtxParams->srcSizeHint;
    }
  }
  ZSTD_getCParams_internal(&local_44,CCtxParams->compressionLevel,srcSizeHint,dictSize);
  uVar7 = 0x1b;
  if ((CCtxParams->ldmParams).enableLdm == 0) {
    uVar7 = local_44.windowLog;
  }
  auVar4._0_4_ = (CCtxParams->cParams).windowLog;
  auVar4._4_4_ = (CCtxParams->cParams).chainLog;
  auVar4._8_4_ = (CCtxParams->cParams).hashLog;
  auVar4._12_4_ = (CCtxParams->cParams).searchLog;
  auVar8 = vpinsrd_avx(ZEXT416(uVar7),local_44.chainLog,1);
  auVar5 = vpcmpeqd_avx(auVar4,(undefined1  [16])0x0);
  auVar6._8_4_ = local_44.minMatch;
  auVar6._12_4_ = local_44.targetLength;
  auVar6._0_4_ = local_44.hashLog;
  auVar6._4_4_ = local_44.searchLog;
  auVar8 = vpunpcklqdq_avx(auVar8,auVar6);
  ZVar3 = (CCtxParams->cParams).strategy;
  if (ZVar3 == 0) {
    ZVar3 = local_44.strategy;
  }
  auVar4 = vblendvps_avx(auVar4,auVar8,auVar5);
  auVar5 = vpaddd_avx(auVar4,_DAT_001b5ab0);
  auVar8 = vpminud_avx(auVar5,_DAT_001b5ac0);
  auVar5 = vpcmpeqd_avx(auVar5,auVar8);
  if ((((auVar5 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar5 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar5 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar5[0xf]) {
    auVar8._8_8_ = 0;
    auVar8._0_4_ = local_44.minMatch;
    auVar8._4_4_ = local_44.targetLength;
    uVar1 = (CCtxParams->cParams).minMatch;
    uVar2 = (CCtxParams->cParams).targetLength;
    auVar9._4_4_ = uVar2;
    auVar9._0_4_ = uVar1;
    auVar9._8_8_ = 0;
    auVar5 = vpcmpeqd_avx(auVar9,(undefined1  [16])0x0);
    auVar5 = vblendvps_avx(auVar9,auVar8,auVar5);
    if (((0xfffffffa < auVar5._0_4_ - 8U) && (auVar5._4_4_ < 0x20001)) &&
       (0xfffffff6 < ZVar3 + ~ZSTD_btultra2)) {
      cPar.strategy = ZVar3;
      cPar.targetLength = auVar5._4_4_;
      cPar.minMatch = auVar5._0_4_;
      cPar.windowLog = auVar4._0_4_;
      cPar.chainLog = auVar4._4_4_;
      cPar.hashLog = auVar4._8_4_;
      cPar.searchLog = auVar4._12_4_;
      ZSTD_adjustCParams_internal(__return_storage_ptr__,cPar,srcSizeHint,dictSize);
      return __return_storage_ptr__;
    }
  }
  __assert_fail("!ZSTD_checkCParams(cParams)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x2e86,
                "ZSTD_compressionParameters ZSTD_getCParamsFromCCtxParams(const ZSTD_CCtx_params *, U64, size_t)"
               );
}

Assistant:

ZSTD_compressionParameters ZSTD_getCParamsFromCCtxParams(
        const ZSTD_CCtx_params* CCtxParams, U64 srcSizeHint, size_t dictSize)
{
    ZSTD_compressionParameters cParams;
    if (srcSizeHint == ZSTD_CONTENTSIZE_UNKNOWN && CCtxParams->srcSizeHint > 0) {
      srcSizeHint = CCtxParams->srcSizeHint;
    }
    cParams = ZSTD_getCParams_internal(CCtxParams->compressionLevel, srcSizeHint, dictSize);
    if (CCtxParams->ldmParams.enableLdm) cParams.windowLog = ZSTD_LDM_DEFAULT_WINDOW_LOG;
    if (CCtxParams->cParams.windowLog) cParams.windowLog = CCtxParams->cParams.windowLog;
    if (CCtxParams->cParams.hashLog) cParams.hashLog = CCtxParams->cParams.hashLog;
    if (CCtxParams->cParams.chainLog) cParams.chainLog = CCtxParams->cParams.chainLog;
    if (CCtxParams->cParams.searchLog) cParams.searchLog = CCtxParams->cParams.searchLog;
    if (CCtxParams->cParams.minMatch) cParams.minMatch = CCtxParams->cParams.minMatch;
    if (CCtxParams->cParams.targetLength) cParams.targetLength = CCtxParams->cParams.targetLength;
    if (CCtxParams->cParams.strategy) cParams.strategy = CCtxParams->cParams.strategy;
    assert(!ZSTD_checkCParams(cParams));
    /* srcSizeHint == 0 means 0 */
    return ZSTD_adjustCParams_internal(cParams, srcSizeHint, dictSize);
}